

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_5::VerifyDirectoryExists(string *path)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  int *piVar5;
  string *path_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = access(pcVar3,0);
    if (iVar1 == -1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,(string *)path);
      poVar4 = std::operator<<(poVar4,": ");
      piVar5 = __errno_location();
      pcVar3 = strerror(*piVar5);
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      path_local._7_1_ = false;
    }
    else {
      path_local._7_1_ = true;
    }
  }
  else {
    path_local._7_1_ = true;
  }
  return path_local._7_1_;
}

Assistant:

bool VerifyDirectoryExists(const std::string& path) {
  if (path.empty()) return true;

  if (access(path.c_str(), F_OK) == -1) {
    std::cerr << path << ": " << strerror(errno) << std::endl;
    return false;
  } else {
    return true;
  }
}